

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  void *pvVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  void *pvVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  Mat mins;
  Mat local_78;
  
  sVar2 = a->elemsize;
  iVar22 = a->dims;
  if (iVar22 == 3) {
    uVar9 = a->w;
    uVar17 = (ulong)uVar9;
    uVar8 = a->h;
    uVar15 = (ulong)uVar8;
    uVar7 = a->c;
    uVar12 = (ulong)uVar7;
    uVar14 = uVar8 * uVar9;
    bVar18 = !reduce_w;
    bVar6 = !reduce_h;
    if ((bVar18 || bVar6) || !reduce_c) {
      if ((!bVar18 && !bVar6) && !reduce_c) {
        Mat::create(b,uVar7,sVar2,opt->blob_allocator);
        if (0 < (int)uVar7) {
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          pvVar10 = a->data;
          pvVar13 = b->data;
          uVar17 = 0;
          do {
            fVar23 = 0.0;
            if (0 < (int)uVar14) {
              uVar15 = 0;
              do {
                fVar1 = *(float *)((long)pvVar10 + uVar15 * 4);
                fVar23 = fVar23 + fVar1 * fVar1;
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            *(float *)((long)pvVar13 + uVar17 * 4) = fVar23;
            uVar17 = uVar17 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
          } while (uVar17 != uVar12);
          return 0;
        }
        return 0;
      }
      lVar11 = (long)(int)uVar9;
      if ((!bVar18 && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar8,uVar7,sVar2,opt->blob_allocator);
        if (0 < (int)uVar7) {
          pvVar10 = a->data;
          sVar2 = a->cstep;
          iVar22 = b->w;
          sVar3 = b->elemsize;
          sVar4 = a->elemsize;
          pvVar13 = b->data;
          uVar16 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar20 = 0;
              pvVar19 = pvVar10;
              do {
                fVar23 = 0.0;
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar19 + uVar21 * 4);
                    fVar23 = fVar23 + fVar1 * fVar1;
                    uVar21 = uVar21 + 1;
                  } while (uVar17 != uVar21);
                }
                *(float *)((long)pvVar13 + uVar20 * 4 + (long)iVar22 * sVar3 * uVar16) = fVar23;
                uVar20 = uVar20 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar11 * 4);
              } while (uVar20 != uVar15);
            }
            uVar16 = uVar16 + 1;
            pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar4);
          } while (uVar16 != uVar12);
          return 0;
        }
        return 0;
      }
      if ((!bVar18 && !reduce_h) && reduce_c) {
        Mat::create(b,uVar8,sVar2,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,1,uVar8,uVar7,sVar2,opt->workspace_allocator);
        pvVar10 = local_78.data;
        iVar22 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_00203fe3;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < (int)uVar7) {
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          pvVar13 = a->data;
          uVar16 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar20 = 0;
              pvVar19 = pvVar13;
              do {
                fVar23 = 0.0;
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  do {
                    fVar1 = *(float *)((long)pvVar19 + uVar21 * 4);
                    fVar23 = fVar23 + fVar1 * fVar1;
                    uVar21 = uVar21 + 1;
                  } while (uVar17 != uVar21);
                }
                *(float *)((long)pvVar10 +
                          uVar20 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * uVar16)
                     = fVar23;
                uVar20 = uVar20 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar11 * 4);
              } while (uVar20 != uVar15);
            }
            uVar16 = uVar16 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
          } while (uVar16 != uVar12);
        }
        uVar9 = b->c * (int)b->cstep;
        if (0 < (int)uVar9) {
          memset(b->data,0,(ulong)uVar9 << 2);
        }
        if (0 < (int)uVar7) {
          pvVar10 = b->data;
          uVar17 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar8) {
              uVar16 = 0;
              do {
                *(float *)((long)pvVar10 + uVar16 * 4) =
                     *(float *)((long)pvVar13 + uVar16 * 4) + *(float *)((long)pvVar10 + uVar16 * 4)
                ;
                uVar16 = uVar16 + 1;
              } while (uVar15 != uVar16);
            }
            uVar17 = uVar17 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar17 != uVar12);
        }
      }
      else {
        if ((bVar6 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar9,uVar8,sVar2,opt->blob_allocator);
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < (int)uVar7) {
              sVar2 = a->cstep;
              sVar3 = a->elemsize;
              pvVar10 = a->data;
              pvVar13 = b->data;
              uVar17 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar15 = 0;
                  do {
                    fVar23 = *(float *)((long)pvVar10 + uVar15 * 4);
                    *(float *)((long)pvVar13 + uVar15 * 4) =
                         fVar23 * fVar23 + *(float *)((long)pvVar13 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar14 != uVar15);
                }
                uVar17 = uVar17 + 1;
                pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
              } while (uVar17 != uVar12);
              return 0;
            }
            return 0;
          }
          if ((bVar6 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar9,uVar7,sVar2,opt->blob_allocator);
          uVar14 = b->c * (int)b->cstep;
          if (0 < (int)uVar14) {
            memset(b->data,0,(ulong)uVar14 << 2);
          }
          if (0 < (int)uVar7) {
            pvVar10 = a->data;
            sVar2 = a->cstep;
            pvVar13 = b->data;
            iVar22 = b->w;
            sVar3 = a->elemsize;
            sVar4 = b->elemsize;
            uVar15 = 0;
            do {
              if (0 < (int)uVar8) {
                uVar7 = 0;
                pvVar19 = pvVar10;
                do {
                  if (0 < (int)uVar9) {
                    uVar16 = 0;
                    do {
                      fVar23 = *(float *)((long)pvVar19 + uVar16 * 4);
                      *(float *)((long)pvVar13 + uVar16 * 4) =
                           fVar23 * fVar23 + *(float *)((long)pvVar13 + uVar16 * 4);
                      uVar16 = uVar16 + 1;
                    } while (uVar17 != uVar16);
                  }
                  uVar7 = uVar7 + 1;
                  pvVar19 = (void *)((long)pvVar19 + lVar11 * 4);
                } while (uVar7 != uVar8);
              }
              uVar15 = uVar15 + 1;
              pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
              pvVar13 = (void *)((long)pvVar13 + (long)iVar22 * sVar4);
            } while (uVar15 != uVar12);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar9,sVar2,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,uVar9,1,uVar7,sVar2,opt->workspace_allocator);
        pvVar10 = local_78.data;
        iVar22 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_00203fe3;
        uVar14 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar14) {
          memset(local_78.data,0,(ulong)uVar14 << 2);
        }
        if (0 < (int)uVar7) {
          pvVar13 = a->data;
          sVar2 = a->cstep;
          sVar3 = a->elemsize;
          uVar15 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar14 = 0;
              pvVar19 = pvVar13;
              do {
                if (0 < (int)uVar9) {
                  uVar16 = 0;
                  do {
                    fVar23 = *(float *)((long)pvVar19 + uVar16 * 4);
                    *(float *)((long)pvVar10 + uVar16 * 4) =
                         fVar23 * fVar23 + *(float *)((long)pvVar10 + uVar16 * 4);
                    uVar16 = uVar16 + 1;
                  } while (uVar17 != uVar16);
                }
                uVar14 = uVar14 + 1;
                pvVar19 = (void *)((long)pvVar19 + lVar11 * 4);
              } while (uVar14 != uVar8);
            }
            uVar15 = uVar15 + 1;
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
            pvVar10 = (void *)((long)pvVar10 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar15 != uVar12);
        }
        uVar8 = b->c * (int)b->cstep;
        if (0 < (int)uVar8) {
          memset(b->data,0,(ulong)uVar8 << 2);
        }
        if (0 < (int)uVar7) {
          pvVar10 = b->data;
          uVar15 = 0;
          pvVar13 = local_78.data;
          do {
            if (0 < (int)uVar9) {
              uVar16 = 0;
              do {
                *(float *)((long)pvVar10 + uVar16 * 4) =
                     *(float *)((long)pvVar13 + uVar16 * 4) + *(float *)((long)pvVar10 + uVar16 * 4)
                ;
                uVar16 = uVar16 + 1;
              } while (uVar17 != uVar16);
            }
            uVar15 = uVar15 + 1;
            pvVar13 = (void *)((long)pvVar13 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar15 != uVar12);
        }
      }
      iVar22 = 0;
LAB_00203fe3:
      Mat::~Mat(&local_78);
      return iVar22;
    }
    Mat::create(b,1,sVar2,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar7,sVar2,opt->workspace_allocator);
    iVar22 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if ((int)uVar7 < 1) {
LAB_00203c82:
        fVar23 = 0.0;
      }
      else {
        pvVar10 = a->data;
        sVar2 = a->cstep;
        sVar3 = a->elemsize;
        uVar17 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar14) {
            uVar15 = 0;
            do {
              fVar1 = *(float *)((long)pvVar10 + uVar15 * 4);
              fVar23 = fVar23 + fVar1 * fVar1;
              uVar15 = uVar15 + 1;
            } while (uVar14 != uVar15);
          }
          *(float *)((long)local_78.data + uVar17 * 4) = fVar23;
          uVar17 = uVar17 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar2 * sVar3);
        } while (uVar17 != uVar12);
        if ((int)uVar7 < 1) goto LAB_00203c82;
        fVar23 = 0.0;
        uVar17 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)local_78.data + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar12 != uVar17);
      }
      *(float *)b->data = fVar23;
      iVar22 = 0;
    }
    piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar22;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar22;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return iVar22;
    }
    goto LAB_00203cc0;
  }
  if (iVar22 != 2) {
    if (iVar22 == 1) {
      iVar22 = a->w;
      Mat::create(b,1,sVar2,opt->blob_allocator);
      if ((long)iVar22 < 1) {
        fVar23 = 0.0;
      }
      else {
        fVar23 = 0.0;
        lVar11 = 0;
        do {
          fVar1 = *(float *)((long)a->data + lVar11 * 4);
          fVar23 = fVar23 + fVar1 * fVar1;
          lVar11 = lVar11 + 1;
        } while (iVar22 != lVar11);
      }
      *(float *)b->data = fVar23;
      return 0;
    }
    return 0;
  }
  uVar9 = a->w;
  uVar12 = (ulong)uVar9;
  uVar8 = a->h;
  uVar17 = (ulong)uVar8;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,uVar8,sVar2,opt->blob_allocator);
      if (0 < (int)uVar8) {
        pvVar10 = a->data;
        iVar22 = a->w;
        sVar2 = a->elemsize;
        pvVar13 = b->data;
        uVar15 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar9) {
            uVar16 = 0;
            do {
              fVar1 = *(float *)((long)pvVar10 + uVar16 * 4);
              fVar23 = fVar23 + fVar1 * fVar1;
              uVar16 = uVar16 + 1;
            } while (uVar12 != uVar16);
          }
          *(float *)((long)pvVar13 + uVar15 * 4) = fVar23;
          uVar15 = uVar15 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)iVar22 * sVar2);
        } while (uVar15 != uVar17);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar9,sVar2,opt->blob_allocator);
    uVar7 = b->c * (int)b->cstep;
    if (0 < (int)uVar7) {
      memset(b->data,0,(ulong)uVar7 << 2);
    }
    if (0 < (int)uVar8) {
      pvVar10 = a->data;
      iVar22 = a->w;
      sVar2 = a->elemsize;
      pvVar13 = b->data;
      uVar15 = 0;
      do {
        if (0 < (int)uVar9) {
          uVar16 = 0;
          do {
            fVar23 = *(float *)((long)pvVar10 + uVar16 * 4);
            *(float *)((long)pvVar13 + uVar16 * 4) =
                 fVar23 * fVar23 + *(float *)((long)pvVar13 + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        uVar15 = uVar15 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)iVar22 * sVar2);
      } while (uVar15 != uVar17);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,sVar2,opt->blob_allocator);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,uVar8,sVar2,opt->workspace_allocator);
  iVar22 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if ((int)uVar8 < 1) {
LAB_00203c43:
      fVar23 = 0.0;
    }
    else {
      pvVar10 = a->data;
      iVar22 = a->w;
      sVar2 = a->elemsize;
      uVar15 = 0;
      do {
        fVar23 = 0.0;
        if (0 < (int)uVar9) {
          uVar16 = 0;
          do {
            fVar1 = *(float *)((long)pvVar10 + uVar16 * 4);
            fVar23 = fVar23 + fVar1 * fVar1;
            uVar16 = uVar16 + 1;
          } while (uVar12 != uVar16);
        }
        *(float *)((long)local_78.data + uVar15 * 4) = fVar23;
        uVar15 = uVar15 + 1;
        pvVar10 = (void *)((long)pvVar10 + (long)iVar22 * sVar2);
      } while (uVar15 != uVar17);
      if ((int)uVar8 < 1) goto LAB_00203c43;
      fVar23 = 0.0;
      uVar12 = 0;
      do {
        fVar23 = fVar23 + *(float *)((long)local_78.data + uVar12 * 4);
        uVar12 = uVar12 + 1;
      } while (uVar17 != uVar12);
    }
    *(float *)b->data = fVar23;
    iVar22 = 0;
  }
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 == (int *)0x0) {
    return iVar22;
  }
  LOCK();
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return iVar22;
  }
  if (local_78.allocator != (Allocator *)0x0) {
    (*(local_78.allocator)->_vptr_Allocator[3])();
    return iVar22;
  }
LAB_00203cc0:
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
  return iVar22;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}